

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

bool __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::hasData
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  DeviceBufferType DVar1;
  
  if ((((this->hostBufferIsPopulated == false) &&
       ((DVar1 = this->deviceBufferType, DVar1 != Attribute ||
        ((this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         == (element_type *)0x0)))) &&
      ((DVar1 != Texture1d ||
       ((this->renderTextureBuffer).
        super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)))) &&
     ((DVar1 != Texture2d ||
      ((this->renderTextureBuffer).
       super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0)))) {
    return (this->renderTextureBuffer).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           != (element_type *)0x0 && DVar1 == Texture3d;
  }
  return true;
}

Assistant:

bool ManagedBuffer<T>::hasData() {

  if (hostBufferIsPopulated) return true;
  if (deviceBufferType == DeviceBufferType::Attribute && renderAttributeBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture1d && renderTextureBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture2d && renderTextureBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture3d && renderTextureBuffer) return true;
  return false;
}